

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2text_format.cc
# Opt level: O0

unique_ptr<MutableS2ShapeIndex,_std::default_delete<MutableS2ShapeIndex>_>
s2textformat::MakeIndexOrDie(string_view str)

{
  string_view str_00;
  bool bVar1;
  ostream *poVar2;
  absl *this;
  size_type sVar3;
  char *in_RDX;
  __uniq_ptr_data<MutableS2ShapeIndex,_std::default_delete<MutableS2ShapeIndex>,_true,_true>
  index_00;
  string_view piece;
  S2LogMessage local_58;
  S2LogMessageVoidify local_45 [13];
  ostream *local_38;
  char *pcStack_30;
  undefined1 local_21;
  ostream *poStack_20;
  string_view str_local;
  scalar *index;
  
  poStack_20 = (ostream *)str.length_;
  index_00.super___uniq_ptr_impl<MutableS2ShapeIndex,_std::default_delete<MutableS2ShapeIndex>_>.
  _M_t.super__Tuple_impl<0UL,_MutableS2ShapeIndex_*,_std::default_delete<MutableS2ShapeIndex>_>.
  super__Head_base<0UL,_MutableS2ShapeIndex_*,_false>._M_head_impl =
       (__uniq_ptr_impl<MutableS2ShapeIndex,_std::default_delete<MutableS2ShapeIndex>_>)str.ptr_;
  local_21 = 0;
  str_local.ptr_ = in_RDX;
  str_local.length_ =
       (size_type)
       index_00.
       super___uniq_ptr_impl<MutableS2ShapeIndex,_std::default_delete<MutableS2ShapeIndex>_>._M_t.
       super__Tuple_impl<0UL,_MutableS2ShapeIndex_*,_std::default_delete<MutableS2ShapeIndex>_>.
       super__Head_base<0UL,_MutableS2ShapeIndex_*,_false>._M_head_impl;
  absl::make_unique<MutableS2ShapeIndex>();
  local_38 = poStack_20;
  pcStack_30 = str_local.ptr_;
  str_00.length_ = (size_type)str_local.ptr_;
  str_00.ptr_ = (char *)poStack_20;
  bVar1 = MakeIndex(str_00,(unique_ptr<MutableS2ShapeIndex,_std::default_delete<MutableS2ShapeIndex>_>
                            *)index_00.
                              super___uniq_ptr_impl<MutableS2ShapeIndex,_std::default_delete<MutableS2ShapeIndex>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_MutableS2ShapeIndex_*,_std::default_delete<MutableS2ShapeIndex>_>
                              .super__Head_base<0UL,_MutableS2ShapeIndex_*,_false>._M_head_impl);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    return (__uniq_ptr_data<MutableS2ShapeIndex,_std::default_delete<MutableS2ShapeIndex>,_true,_true>
            )(tuple<MutableS2ShapeIndex_*,_std::default_delete<MutableS2ShapeIndex>_>)
             index_00.
             super___uniq_ptr_impl<MutableS2ShapeIndex,_std::default_delete<MutableS2ShapeIndex>_>.
             _M_t.
             super__Tuple_impl<0UL,_MutableS2ShapeIndex_*,_std::default_delete<MutableS2ShapeIndex>_>
             .super__Head_base<0UL,_MutableS2ShapeIndex_*,_false>._M_head_impl;
  }
  sVar3 = 3;
  S2FatalLogMessage::S2FatalLogMessage
            ((S2FatalLogMessage *)&local_58,
             "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2text_format.cc"
             ,0x134,kFatal,(ostream *)&std::cerr);
  poVar2 = S2LogMessage::stream(&local_58);
  poVar2 = std::operator<<(poVar2,"Check failed: MakeIndex(str, &index) ");
  this = (absl *)std::operator<<(poVar2,": str == \"");
  piece.length_ = sVar3;
  piece.ptr_ = str_local.ptr_;
  poVar2 = absl::operator<<(this,poStack_20,piece);
  poVar2 = std::operator<<(poVar2,"\"");
  S2LogMessageVoidify::operator&(local_45,poVar2);
  S2FatalLogMessage::~S2FatalLogMessage((S2FatalLogMessage *)&local_58);
}

Assistant:

unique_ptr<MutableS2ShapeIndex> MakeIndexOrDie(string_view str) {
  auto index = make_unique<MutableS2ShapeIndex>();
  S2_CHECK(MakeIndex(str, &index)) << ": str == \"" << str << "\"";
  return index;
}